

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddCScriptWithDB
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CScript *redeemScript)

{
  WalletStorage *pWVar1;
  bool bVar2;
  long in_FS_OFFSET;
  uint160 local_3c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = FillableSigningProvider::AddCScript
                    (&(this->super_LegacyDataSPKM).super_FillableSigningProvider,redeemScript);
  if (bVar2) {
    Hash160<CScript>(&local_3c,redeemScript);
    bVar2 = WalletBatch::WriteCScript(batch,&local_3c,redeemScript);
    if (bVar2) {
      pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
      (*pWVar1->_vptr_WalletStorage[5])(pWVar1,batch);
      bVar2 = true;
      goto LAB_001f6a8b;
    }
  }
  bVar2 = false;
LAB_001f6a8b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::AddCScriptWithDB(WalletBatch& batch, const CScript& redeemScript)
{
    if (!FillableSigningProvider::AddCScript(redeemScript))
        return false;
    if (batch.WriteCScript(Hash160(redeemScript), redeemScript)) {
        m_storage.UnsetBlankWalletFlag(batch);
        return true;
    }
    return false;
}